

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void clearAndDestroyQLayoutItem(QLayoutItem *item)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QLayoutItem *item_00;
  long *plVar2;
  
  if (item == (QLayoutItem *)0x0) {
    return;
  }
  iVar1 = (*item->_vptr_QLayoutItem[0xd])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0x20))(plVar2);
  }
  iVar1 = (*item->_vptr_QLayoutItem[0xe])(item);
  plVar2 = (long *)CONCAT44(extraout_var_00,iVar1);
  if (plVar2 != (long *)0x0) {
    while (item_00 = (QLayoutItem *)(**(code **)(*plVar2 + 0xb0))(plVar2,0),
          item_00 != (QLayoutItem *)0x0) {
      clearAndDestroyQLayoutItem(item_00);
    }
  }
  (*item->_vptr_QLayoutItem[1])(item);
  return;
}

Assistant:

static void clearAndDestroyQLayoutItem(QLayoutItem *item)
{
    if (Q_LIKELY(item)) {
        delete item->widget();
        if (QLayout *layout = item->layout()) {
            while (QLayoutItem *child = layout->takeAt(0))
                clearAndDestroyQLayoutItem(child);
        }
        delete item;
    }
}